

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify.cc
# Opt level: O3

Regexp * re2::SimplifyWalker::Concat2(Regexp *re1,Regexp *re2,ParseFlags parse_flags)

{
  Regexp *this;
  Regexp **ppRVar1;
  
  this = (Regexp *)operator_new(0x28);
  Regexp::Regexp(this,kRegexpConcat,parse_flags);
  ppRVar1 = (Regexp **)operator_new__(0x10);
  (this->field_5).submany_ = ppRVar1;
  this->nsub_ = 2;
  *ppRVar1 = re1;
  ppRVar1[1] = re2;
  return this;
}

Assistant:

Regexp* SimplifyWalker::Concat2(Regexp* re1, Regexp* re2,
                                Regexp::ParseFlags parse_flags) {
  Regexp* re = new Regexp(kRegexpConcat, parse_flags);
  re->AllocSub(2);
  Regexp** subs = re->sub();
  subs[0] = re1;
  subs[1] = re2;
  return re;
}